

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_features.c
# Opt level: O2

LY_ERR lys_identity_iffeature_value(lysc_ident *ident)

{
  lysp_ident *plVar1;
  lysp_module *plVar2;
  lysp_include *plVar3;
  lysp_ident *plVar4;
  lysp_ident *plVar5;
  LY_ERR LVar6;
  lysp_ident *plVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  lysp_ident *plVar11;
  ulong uVar12;
  ly_bool enabled;
  
  if (ident == (lysc_ident *)0x0) {
    pcVar10 = "ident";
  }
  else {
    plVar2 = ident->module->parsed;
    if (plVar2 != (lysp_module *)0x0) {
      plVar11 = plVar2->identities;
      plVar7 = plVar11 + -1;
      uVar9 = 0xffffffffffffffff;
      while( true ) {
        if (plVar11 == (lysp_ident *)0x0) {
          uVar12 = 0;
        }
        else {
          uVar12 = *(ulong *)&plVar11[-1].flags;
        }
        uVar9 = uVar9 + 1;
        if (uVar12 <= uVar9) break;
        plVar4 = plVar7 + 1;
        plVar7 = plVar7 + 1;
        if (plVar4->name == ident->name) goto LAB_001501f2;
      }
      plVar3 = plVar2->includes;
      plVar7 = (lysp_ident *)0x0;
      uVar9 = 0;
      while( true ) {
        if (plVar3 == (lysp_include *)0x0) {
          uVar12 = 0;
        }
        else {
          uVar12 = *(ulong *)(plVar3[-1].rev + 8);
        }
        if (uVar12 <= uVar9) break;
        plVar4 = (plVar3[uVar9].submodule)->identities;
        plVar11 = plVar4 + -1;
        uVar12 = 0xffffffffffffffff;
        do {
          if (plVar4 == (lysp_ident *)0x0) {
            uVar8 = 0;
          }
          else {
            uVar8 = *(ulong *)&plVar4[-1].flags;
          }
          uVar12 = uVar12 + 1;
          plVar5 = plVar7;
        } while ((uVar12 < uVar8) &&
                (plVar1 = plVar11 + 1, plVar11 = plVar11 + 1, plVar5 = plVar11,
                plVar1->name != ident->name));
        plVar7 = plVar5;
        uVar9 = uVar9 + 1;
      }
      if (plVar7 == (lysp_ident *)0x0) {
        __assert_fail("found_ident",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_features.c"
                      ,0x85,"LY_ERR lys_identity_iffeature_value(const struct lysc_ident *)");
      }
LAB_001501f2:
      LVar6 = lys_eval_iffeatures(ident->module->ctx,plVar7->iffeatures,&enabled);
      if (LVar6 != LY_SUCCESS) {
        return LVar6;
      }
      if (enabled == '\0') {
        return LY_ENOT;
      }
      return LY_SUCCESS;
    }
    pcVar10 = "ident->module->parsed";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar10,
         "lys_identity_iffeature_value");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_identity_iffeature_value(const struct lysc_ident *ident)
{
    LY_ARRAY_COUNT_TYPE u, v;
    ly_bool enabled;
    const struct lysp_ident *idents_p, *found_ident = NULL;
    struct lysp_include *includes;

    LY_CHECK_ARG_RET(NULL, ident, ident->module->parsed, LY_EINVAL);

    /* Search parsed identity in the module. */
    idents_p = ident->module->parsed->identities;
    LY_ARRAY_FOR(idents_p, u) {
        if (idents_p[u].name == ident->name) {
            found_ident = &idents_p[u];
            break;
        }
    }

    if (!found_ident) {
        /* It is not in the module, so it must be in some submodule. */
        includes = ident->module->parsed->includes;
        LY_ARRAY_FOR(includes, u) {
            idents_p = includes[u].submodule->identities;
            LY_ARRAY_FOR(idents_p, v) {
                if (idents_p[v].name == ident->name) {
                    found_ident = &idents_p[v];
                    break;
                }
            }
        }
    }

    assert(found_ident);

    /* Evaluate its if-feature. */
    LY_CHECK_RET(lys_eval_iffeatures(ident->module->ctx, found_ident->iffeatures, &enabled));
    if (!enabled) {
        return LY_ENOT;
    }

    return LY_SUCCESS;
}